

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

void __thiscall Schedule::restoreAndDumpToFile(Schedule *this,string *path)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  json json;
  string_t local_238;
  ofstream file;
  
  Common::restore((this->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  &this->head);
  bVar1 = Common::check((this->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,&this->head);
  if (bVar1) {
    Common::toJson_abi_cxx11_
              ((Common *)&json,
               (TaskHandle *)
               (this->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::ofstream::ofstream(&file,(string *)path,_S_out);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_238,&json,4,' ',false,strict);
    poVar2 = std::operator<<((ostream *)&file,(string *)&local_238);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_238);
    std::ofstream::~ofstream(&file);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&json);
    return;
  }
  error("Check failed while dumping to file.\n");
  std::ofstream::~ofstream(&file);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&json);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void restoreAndDumpToFile(const std::string &path) {
        // Restore to the format with attributes, .dealloc and .share
        common->restore(head);
        if (not common->check(head)) {
            error("Check failed while dumping to file.\n");
        }

        // Dump into json
        auto json = common->toJson(head);
        std::ofstream file(path);
        file << json.dump(4) << std::endl;
    }